

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerSweepManager.cpp
# Opt level: O2

void __thiscall Memory::RecyclerSweepManager::StartPartialCollectMode(RecyclerSweepManager *this)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  Recycler *pRVar4;
  ulong uVar5;
  ulong uVar6;
  undefined8 *in_FS_OFFSET;
  
  pRVar4 = this->recycler;
  bVar3 = pRVar4->inPartialCollectMode;
  this->inPartialCollect = bVar3;
  pRVar4->inPartialCollectMode = true;
  uVar5 = pRVar4->partialUncollectedAllocBytes;
  if (uVar5 == 0) {
    this->lastPartialUncollectedAllocBytes = 0;
    uVar6 = (pRVar4->autoHeap).uncollectedAllocBytes;
  }
  else {
    if (bVar3 == false) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar1 = (undefined4 *)*in_FS_OFFSET;
      *puVar1 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerSweepManager.cpp"
                         ,0x159,
                         "(recycler->partialUncollectedAllocBytes == 0 || this->inPartialCollect)",
                         "recycler->partialUncollectedAllocBytes == 0 || this->inPartialCollect");
      if (!bVar3) goto LAB_002a638e;
      *puVar1 = 0;
      pRVar4 = this->recycler;
      uVar5 = pRVar4->partialUncollectedAllocBytes;
    }
    this->lastPartialUncollectedAllocBytes = uVar5;
    uVar6 = (pRVar4->autoHeap).uncollectedAllocBytes;
    if (uVar6 < uVar5) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar1 = (undefined4 *)*in_FS_OFFSET;
      *puVar1 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerSweepManager.cpp"
                         ,0x15d,
                         "(currentUncollectedAllocBytes >= this->lastPartialUncollectedAllocBytes)",
                         "currentUncollectedAllocBytes >= this->lastPartialUncollectedAllocBytes");
      if (!bVar3) {
LAB_002a638e:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar1 = 0;
      pRVar4 = this->recycler;
    }
  }
  if (this->inPartialCollect == false) {
    uVar6 = uVar6 + (pRVar4->autoHeap).lastUncollectedAllocBytes;
  }
  pRVar4->partialUncollectedAllocBytes = uVar6;
  this->nextPartialUncollectedAllocBytes = uVar6;
  bVar3 = Js::Phases::IsEnabled(&pRVar4->recyclerFlagsTable->Trace,PartialCollectPhase);
  if (bVar3) {
    Output::Print(L"StartPartialCollectMode\n");
    Output::Print(L"  was inPartialCollectMode = %d\n",(ulong)this->inPartialCollect);
    Output::Print(L"  lastPartialUncollectedAllocBytes = %d\n",
                  this->lastPartialUncollectedAllocBytes);
    Output::Print(L"  uncollectedAllocBytes = %d\n",(this->recycler->autoHeap).uncollectedAllocBytes
                 );
    Output::Print(L"  nextPartialUncollectedAllocBytes = %d\n",
                  this->nextPartialUncollectedAllocBytes);
    return;
  }
  return;
}

Assistant:

void
RecyclerSweepManager::StartPartialCollectMode()
{
    // Save the in partial collect, the main thread reset it after returning to the script
    // and the background thread still needs it
    this->inPartialCollect = recycler->inPartialCollectMode;
    recycler->inPartialCollectMode = true;

    // Tracks the unallocated alloc bytes for partial GC

    // Keep a copy Last collection's uncollected allocation bytes, so we can use it to calculate
    // the new object that is allocated since the last GC
    Assert(recycler->partialUncollectedAllocBytes == 0 || this->inPartialCollect);
    this->lastPartialUncollectedAllocBytes = recycler->partialUncollectedAllocBytes;

    size_t currentUncollectedAllocBytes = recycler->autoHeap.uncollectedAllocBytes;
    Assert(currentUncollectedAllocBytes >= this->lastPartialUncollectedAllocBytes);

    if (!this->inPartialCollect)
    {
        // If we did a full collect, then we need to include lastUncollectedAllocBytes
        // in the partialUncollectedAllocBytes calculation, because all objects allocated
        // since the previous GC are considered new, but we cleared uncollectedAllocBytes
        // when we kicked off the GC.
        currentUncollectedAllocBytes += recycler->autoHeap.lastUncollectedAllocBytes;
    }

    // Initially, the partial uncollected alloc bytes is the current uncollectedAllocBytes
    recycler->partialUncollectedAllocBytes = currentUncollectedAllocBytes;
    this->nextPartialUncollectedAllocBytes = currentUncollectedAllocBytes;

#ifdef RECYCLER_TRACE
    if (recycler->GetRecyclerFlagsTable().Trace.IsEnabled(Js::PartialCollectPhase))
    {
        Output::Print(_u("StartPartialCollectMode\n"));
        Output::Print(_u("  was inPartialCollectMode = %d\n"), this->inPartialCollect);
        Output::Print(_u("  lastPartialUncollectedAllocBytes = %d\n"), this->lastPartialUncollectedAllocBytes);
        Output::Print(_u("  uncollectedAllocBytes = %d\n"), recycler->autoHeap.uncollectedAllocBytes);
        Output::Print(_u("  nextPartialUncollectedAllocBytes = %d\n"), this->nextPartialUncollectedAllocBytes);
    }
#endif
}